

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O3

bool __thiscall TasgridWrapper::checkSanePostRead(TasgridWrapper *this)

{
  TypeCommand TVar1;
  long lVar2;
  long *plVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  undefined1 uVar7;
  TypeCommand TVar8;
  __normal_iterator<const_TypeCommand_*,_std::vector<TypeCommand,_std::allocator<TypeCommand>_>_>
  _Var9;
  int iVar10;
  bool bVar11;
  test_result_wrapper test;
  command_tester com;
  test_result_wrapper local_8d;
  command_tester local_8c;
  vector<TypeCommand,_std::allocator<TypeCommand>_> local_88;
  vector<TypeCommand,_std::allocator<TypeCommand>_> local_68;
  array<TypeCommand,_9UL> local_48;
  
  local_8c.command = this->command;
  local_8d.pass = true;
  lVar2 = *(long *)&this->field_0x8;
  if (((lVar2 == 0) || (*(int *)(lVar2 + 0x14) == 0)) || (*(int *)(lVar2 + 0x20) == 0)) {
    local_48._M_elems[4] = command_getcoefficients;
    local_48._M_elems[5] = command_refine;
    local_48._M_elems[6] = command_refine_aniso;
    local_48._M_elems[7] = command_refine_surp;
    local_48._M_elems[0] = command_evaluate;
    local_48._M_elems[1] = command_differentiate;
    local_48._M_elems[2] = command_integrate;
    local_48._M_elems[3] = command_getanisocoeff;
    local_68.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = command_tester::inside<8ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                      (&local_8c,(array<TypeCommand,_8UL> *)&local_48,&local_68);
    bVar11 = true;
  }
  else {
    bVar11 = false;
    bVar4 = false;
  }
  test_result_wrapper::fail_if(&local_8d,bVar4,"the grid has no loaded data");
  if ((bVar11) &&
     (local_68.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_68.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((*(long *)&this->field_0x8 == 0) || (*(int *)(*(long *)&this->field_0x8 + 0x14) == 0)) {
    local_48._M_elems[4] = command_getcoefficients;
    local_48._M_elems[5] = command_refine;
    local_48._M_elems[6] = command_refine_aniso;
    local_48._M_elems[7] = command_refine_surp;
    local_48._M_elems[0] = command_evaluate;
    local_48._M_elems[1] = command_differentiate;
    local_48._M_elems[2] = command_integrate;
    local_48._M_elems[3] = command_getanisocoeff;
    local_48._M_elems[8] = command_get_candidate_construction;
    local_88.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = command_tester::inside<9ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                      (&local_8c,&local_48,&local_88);
    bVar11 = true;
  }
  else {
    bVar11 = false;
    bVar4 = false;
  }
  test_result_wrapper::fail_if(&local_8d,bVar4,"the grid has no outputs");
  if ((bVar11) &&
     (local_88.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_88.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)&this->field_0x8 == 0) {
    iVar10 = 0;
  }
  else {
    iVar10 = *(int *)(*(long *)&this->field_0x8 + 0x14);
  }
  if (this->ref_output < iVar10) {
    bVar11 = false;
  }
  else {
    bVar11 = true;
    if (local_8c.command != command_getanisocoeff) {
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<TypeCommand_const*,std::vector<TypeCommand,std::allocator<TypeCommand>>>,__gnu_cxx::__ops::_Iter_pred<command_tester::inside<1ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>(std::array<TypeCommand,1ul>const&,std::vector<TypeCommand,std::allocator<TypeCommand>>const&)::_lambda(TypeCommand)_2_>>
                        (0,0,&local_8c);
      bVar11 = _Var9._M_current != (TypeCommand *)0x0;
    }
  }
  test_result_wrapper::fail_if
            (&local_8d,bVar11,"-refout outside of the range, note the outputs are indexed from zero"
            );
  if ((((this->ref_output == -1) && (plVar3 = *(long **)&this->field_0x8, plVar3 != (long *)0x0)) &&
      (1 < *(int *)((long)plVar3 + 0x14))) &&
     (cVar5 = (**(code **)(*plVar3 + 0x10))(), cVar5 != '\0')) {
    bVar11 = true;
    if (local_8c.command != command_getanisocoeff) {
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<TypeCommand_const*,std::vector<TypeCommand,std::allocator<TypeCommand>>>,__gnu_cxx::__ops::_Iter_pred<command_tester::inside<1ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>(std::array<TypeCommand,1ul>const&,std::vector<TypeCommand,std::allocator<TypeCommand>>const&)::_lambda(TypeCommand)_2_>>
                        (0,0,&local_8c);
      bVar11 = _Var9._M_current != (TypeCommand *)0x0;
    }
  }
  else {
    bVar11 = false;
  }
  test_result_wrapper::fail_if
            (&local_8d,bVar11,"-refout cannot use -1 when working with Global grids");
  if ((*(long **)&this->field_0x8 == (long *)0x0) ||
     ((cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x20))(), cVar5 == '\0' &&
      ((*(long **)&this->field_0x8 == (long *)0x0 ||
       (cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x28))(), cVar5 == '\0')))))) {
    bVar11 = false;
  }
  else {
    bVar11 = this->command == command_refine_aniso;
  }
  test_result_wrapper::fail_if
            (&local_8d,bVar11,
             "anisotropic operations are available only for Global, Sequence and Fourier grids");
  if (*(long **)&this->field_0x8 == (long *)0x0) {
    bVar6 = 0;
  }
  else {
    bVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x30))();
  }
  test_result_wrapper::fail_if
            (&local_8d,(bool)(this->command == command_refine_surp & bVar6),
             "surplus refinement cannot be applied to Fourier grids");
  TVar1 = this->command;
  if (TVar1 == command_refine_aniso) {
LAB_0012d932:
    if (*(long **)&this->field_0x8 == (long *)0x0) {
LAB_0012d95a:
      uVar7 = false;
    }
    else {
      cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x20))();
      uVar7 = true;
      if (cVar5 == '\0') {
        if (*(long **)&this->field_0x8 == (long *)0x0) goto LAB_0012d95a;
        uVar7 = (**(code **)(**(long **)&this->field_0x8 + 0x28))();
      }
    }
    test_result_wrapper::fail_if
              (&local_8d,(bool)uVar7,
               "anisotropic refinement can be applied only to Global, Sequence and Fourier grids");
    test_result_wrapper::fail_if
              (&local_8d,this->depth_type == type_none,
               "anisotropic refinement requires depth type with -tt");
    if ((((this->ref_output == -1) && (plVar3 = *(long **)&this->field_0x8, plVar3 != (long *)0x0))
        && (1 < *(int *)((long)plVar3 + 0x14))) &&
       (cVar5 = (**(code **)(*plVar3 + 0x10))(), cVar5 != '\0')) {
      bVar11 = true;
      if (local_8c.command != command_getanisocoeff) {
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<TypeCommand_const*,std::vector<TypeCommand,std::allocator<TypeCommand>>>,__gnu_cxx::__ops::_Iter_pred<command_tester::inside<1ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>(std::array<TypeCommand,1ul>const&,std::vector<TypeCommand,std::allocator<TypeCommand>>const&)::_lambda(TypeCommand)_2_>>
                          (0,0,&local_8c);
        bVar11 = _Var9._M_current != (TypeCommand *)0x0;
      }
    }
    else {
      bVar11 = false;
    }
    test_result_wrapper::fail_if
              (&local_8d,bVar11,"-refout cannot use -1 when working with Global grids");
    test_result_wrapper::worry_if
              (&local_8d,this->set_tolerance,
               "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -tolerance option"
              );
    test_result_wrapper::worry_if
              (&local_8d,this->set_tref,
               "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -reftype option"
              );
LAB_0012d9e1:
    TVar8 = this->command;
  }
  else if ((TVar1 == command_get_candidate_construction) || (TVar8 = TVar1, TVar1 == command_refine)
          ) {
    if ((*(long **)&this->field_0x8 != (long *)0x0) &&
       ((cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x10))(), cVar5 != '\0' ||
        ((*(long **)&this->field_0x8 != (long *)0x0 &&
         ((cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x18))(), cVar5 != '\0' ||
          ((*(long **)&this->field_0x8 != (long *)0x0 &&
           (cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x30))(), cVar5 != '\0'))))))))))
    goto LAB_0012d932;
    goto LAB_0012d9e1;
  }
  if (TVar8 == command_refine_surp) goto LAB_0012d9ec;
  if ((TVar1 == command_get_candidate_construction) || (TVar1 == command_refine)) {
    if (*(long **)&this->field_0x8 != (long *)0x0) {
      cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x20))();
      if (cVar5 == '\0') {
        if (*(long **)&this->field_0x8 == (long *)0x0) goto LAB_0012daec;
        cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x28))();
        if (cVar5 == '\0') goto LAB_0012daba;
      }
LAB_0012d9ec:
      test_result_wrapper::fail_if
                (&local_8d,(bool)(this->set_tolerance ^ 1),
                 "must specify -tolerance for surplus refinement");
      test_result_wrapper::fail_if
                (&local_8d,(bool)(this->set_tref ^ 1),"must specify -reftype option");
      if (((this->valsfilename)._M_string_length == 0) ||
         (*(long **)&this->field_0x8 == (long *)0x0)) {
LAB_0012daa3:
        uVar7 = false;
      }
      else {
        cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x10))();
        uVar7 = true;
        if (cVar5 == '\0') {
          if (*(long **)&this->field_0x8 == (long *)0x0) goto LAB_0012daa3;
          cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x18))();
          if (cVar5 == '\0') {
            if (*(long **)&this->field_0x8 == (long *)0x0) goto LAB_0012daa3;
            uVar7 = (**(code **)(**(long **)&this->field_0x8 + 0x30))();
          }
        }
      }
      test_result_wrapper::worry_if
                (&local_8d,(bool)uVar7,
                 "the scale factors are not used with Global, Sequence and Fourier grids");
      goto LAB_0012daba;
    }
  }
  else {
LAB_0012daba:
    if ((*(long **)&this->field_0x8 != (long *)0x0) &&
       ((cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x20))(), cVar5 != '\0' ||
        ((*(long **)&this->field_0x8 != (long *)0x0 &&
         (cVar5 = (**(code **)(**(long **)&this->field_0x8 + 0x28))(), cVar5 != '\0')))))) {
      bVar11 = this->command == command_getpoly;
      goto LAB_0012daee;
    }
  }
LAB_0012daec:
  bVar11 = false;
LAB_0012daee:
  test_result_wrapper::fail_if
            (&local_8d,bVar11,"cannot call -getpoly for a grid that is neither Global nor Sequence")
  ;
  return local_8d.pass;
}

Assistant:

bool TasgridWrapper::checkSanePostRead() const{
    command_tester com{command};
    test_result_wrapper test;

    test.fail_if(grid.getNumLoaded() == 0 and
                 com.inside(CArr<8>{command_evaluate, command_differentiate, command_integrate, command_getanisocoeff,
                             command_getcoefficients, command_refine, command_refine_aniso, command_refine_surp}),
                 "the grid has no loaded data");
    test.fail_if(grid.getNumOutputs() == 0 and
                 com.inside(CArr<9>{command_evaluate, command_differentiate, command_integrate, command_getanisocoeff,
                             command_getcoefficients, command_refine, command_refine_aniso, command_refine_surp,
                             command_get_candidate_construction}),
                 "the grid has no outputs");

    test.fail_if(ref_output >= grid.getNumOutputs() and
                 com.inside(CArr<1>{command_getanisocoeff, }),
                 "-refout outside of the range, note the outputs are indexed from zero");
    test.fail_if(ref_output == -1 and grid.getNumOutputs() > 1 and grid.isGlobal() and
                 com.inside(CArr<1>{command_getanisocoeff}),
                 "-refout cannot use -1 when working with Global grids");

    test.fail_if((grid.isLocalPolynomial() or grid.isWavelet()) and command == command_refine_aniso,
                 "anisotropic operations are available only for Global, Sequence and Fourier grids");
    test.fail_if((grid.isFourier() and command == command_refine_surp),
                 "surplus refinement cannot be applied to Fourier grids");

    bool is_refine = (command == command_refine or command == command_get_candidate_construction);
    if (command == command_refine_aniso or (is_refine and (grid.isGlobal() or grid.isSequence() or grid.isFourier()))){
        test.fail_if(grid.isLocalPolynomial() or grid.isWavelet(),
                     "anisotropic refinement can be applied only to Global, Sequence and Fourier grids");
        test.fail_if(depth_type == type_none, "anisotropic refinement requires depth type with -tt");
        test.fail_if(ref_output == -1 and grid.getNumOutputs() > 1 and grid.isGlobal() and
                     com.inside(CArr<1>{command_getanisocoeff}),
                     "-refout cannot use -1 when working with Global grids");

        test.worry_if(set_tolerance, "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -tolerance option");
        test.worry_if(set_tref, "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -reftype option");
    }

    if (command == command_refine_surp or (is_refine and (grid.isLocalPolynomial() or grid.isWavelet()))){
        test.fail_if(not set_tolerance, "must specify -tolerance for surplus refinement");
        test.fail_if(not set_tref, "must specify -reftype option");

        test.worry_if(not valsfilename.empty() and (grid.isGlobal() or grid.isSequence() or grid.isFourier()),
                      "the scale factors are not used with Global, Sequence and Fourier grids");
    }

    test.fail_if((grid.isLocalPolynomial() or grid.isWavelet()) and command == command_getpoly,
                 "cannot call -getpoly for a grid that is neither Global nor Sequence");

    return test;
}